

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::DynamicMapField::SyncMapWithRepeatedFieldNoLock(DynamicMapField *this)

{
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef> *this_00;
  RepeatedPtrField<google::protobuf::Message> *pRVar1;
  Rep *pRVar2;
  once_flag *poVar3;
  Arena *pAVar4;
  bool bVar5;
  string sVar6;
  int iVar7;
  uint32 uVar8;
  undefined4 extraout_var;
  MapKey *field;
  undefined4 extraout_var_00;
  MapKey *field_00;
  LogMessage *other;
  MapValueRef *pMVar9;
  Message *pMVar10;
  undefined4 extraout_var_01;
  string *this_01;
  double dVar11;
  Reflection *this_02;
  void **ppvVar12;
  void **ppvVar13;
  float fVar14;
  string local_e0;
  undefined1 local_c0 [16];
  Node local_b0;
  DynamicMapField *local_88;
  TrivialKey local_80;
  undefined1 auStack_78 [8];
  iterator iter;
  int local_58;
  
  this_00 = &this->map_;
  (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  iVar7 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  field = (MapKey *)Descriptor::map_key((Descriptor *)CONCAT44(extraout_var,iVar7));
  iVar7 = (*(this->default_entry_->super_MessageLite)._vptr_MessageLite[0x13])();
  field_00 = (MapKey *)Descriptor::map_value((Descriptor *)CONCAT44(extraout_var_00,iVar7));
  if ((this->super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>)
      .super_MapFieldBase.arena_ == (Arena *)0x0) {
    local_c0._8_8_ = (this->map_).elements_;
    Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
    iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
    ::SearchFrom((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                  *)local_c0,((InnerMap *)local_c0._8_8_)->index_of_first_non_null_);
    iter.it_.m_ = (InnerMap *)local_b0.kv.k_.key_;
    auStack_78 = (undefined1  [8])local_c0._0_8_;
    iter.it_.node_ = (Node *)local_c0._8_8_;
    if ((Node *)local_c0._0_8_ != (Node *)0x0) {
      do {
        MapValueRef::DeleteData(&(*(value_type **)((long)auStack_78 + 8))->second);
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::
        iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
        ::operator++((iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
                      *)auStack_78);
      } while (auStack_78 != (undefined1  [8])0x0);
    }
  }
  Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::clear(this_00);
  pRVar1 = (this->
           super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
           super_MapFieldBase.repeated_field_;
  pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
  ppvVar13 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar13 = (void **)0x0;
  }
  local_88 = this;
  if (((long)(pRVar1->super_RepeatedPtrFieldBase).current_size_ & 0x1fffffffffffffffU) != 0) {
    do {
      local_58 = 0;
      poVar3 = *(once_flag **)((long)&field[1].val_ + 8);
      if (poVar3 != (once_flag *)0x0) {
        local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_80.key_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar3,(_func_void_FieldDescriptor_ptr **)local_c0,(FieldDescriptor **)&local_80)
        ;
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap +
              (ulong)*(uint *)((long)&field[1].val_ + 0x10) * 4)) {
      case 1:
        uVar8 = Reflection::GetInt32(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field);
        local_58 = 1;
        goto LAB_002e47a6;
      case 2:
        auStack_78 = (undefined1  [8])
                     Reflection::GetInt64(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field);
        local_58 = 2;
        break;
      case 3:
        uVar8 = Reflection::GetUInt32(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field);
        local_58 = 3;
LAB_002e47a6:
        auStack_78._0_4_ = uVar8;
        break;
      case 4:
        auStack_78 = (undefined1  [8])
                     Reflection::GetUInt64(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field);
        local_58 = 4;
        break;
      case 5:
      case 6:
      case 8:
      case 10:
        LogMessage::LogMessage
                  ((LogMessage *)local_c0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/map_field.cc"
                   ,0x1e7);
        other = LogMessage::operator<<((LogMessage *)local_c0,"Can\'t get here.");
        LogFinisher::operator=((LogFinisher *)&local_80,other);
        LogMessage::~LogMessage((LogMessage *)local_c0);
        break;
      case 7:
        bVar5 = Reflection::GetBool(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field);
        local_58 = 7;
        auStack_78[0] = bVar5;
        break;
      case 9:
        Reflection::GetString_abi_cxx11_
                  (&local_e0,this_02,(Message *)*ppvVar13,(FieldDescriptor *)field);
        auStack_78 = (undefined1  [8])&iter.it_.m_;
        iter.it_.m_ = (InnerMap *)((ulong)iter.it_.m_ & 0xffffffffffffff00);
        local_58 = 9;
        iter.it_.node_ = (Node *)0x0;
        std::__cxx11::string::operator=((string *)auStack_78,(string *)&local_e0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
          operator_delete(local_e0._M_dataplus._M_p);
        }
      }
      if ((this->
          super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>).
          super_MapFieldBase.arena_ == (Arena *)0x0) {
        local_80.key_ = (MapKey *)auStack_78;
        Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::FindHelper
                  ((pair<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::iterator_base<const_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>,_unsigned_long>
                    *)local_c0,(this->map_).elements_,&local_80,(TreeIterator *)0x0);
        if ((Node *)local_c0._0_8_ != (Node *)0x0) {
          MapValueRef::DeleteData(&(*(value_type **)(local_c0._0_8_ + 8))->second);
        }
      }
      pMVar9 = Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::operator[]
                         (this_00,(key_type *)auStack_78);
      poVar3 = *(once_flag **)((long)&field_00[1].val_ + 8);
      if (poVar3 != (once_flag *)0x0) {
        local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_80.key_ = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar3,(_func_void_FieldDescriptor_ptr **)local_c0,(FieldDescriptor **)&local_80)
        ;
      }
      pMVar9->type_ =
           *(int *)(FieldDescriptor::kTypeToCppTypeMap +
                   (ulong)*(uint *)((long)&field_00[1].val_ + 0x10) * 4);
      poVar3 = *(once_flag **)((long)&field_00[1].val_ + 8);
      if (poVar3 != (once_flag *)0x0) {
        local_c0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_80.key_ = field_00;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (poVar3,(_func_void_FieldDescriptor_ptr **)local_c0,(FieldDescriptor **)&local_80)
        ;
      }
      switch(*(undefined4 *)
              (FieldDescriptor::kTypeToCppTypeMap +
              (ulong)*(uint *)((long)&field_00[1].val_ + 0x10) * 4)) {
      case 1:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(4);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&int::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(undefined4 *)this_01 = 0;
        uVar8 = Reflection::GetInt32(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
        goto LAB_002e4bcc;
      case 2:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(8);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&long::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(double *)this_01 = 0.0;
        dVar11 = (double)Reflection::GetInt64
                                   (this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
        goto LAB_002e4bfb;
      case 3:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(4);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&unsigned_int::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(undefined4 *)this_01 = 0;
        uVar8 = Reflection::GetUInt32(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
        goto LAB_002e4bcc;
      case 4:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(8);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&unsigned_long::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(double *)this_01 = 0.0;
        dVar11 = (double)Reflection::GetUInt64
                                   (this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
LAB_002e4bfb:
        *(double *)this_01 = dVar11;
        break;
      case 5:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(8);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&double::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(double *)this_01 = 0.0;
        dVar11 = Reflection::GetDouble(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
        *(double *)this_01 = dVar11;
        break;
      case 6:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(4);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&float::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(undefined4 *)this_01 = 0;
        fVar14 = Reflection::GetFloat(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
        *(float *)this_01 = fVar14;
        break;
      case 7:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(1);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&bool::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *this_01 = (string)0x0;
        sVar6 = (string)Reflection::GetBool(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00
                                           );
        *this_01 = sVar6;
        break;
      case 8:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(4);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&int::typeinfo,8);
          }
          this_01 = (string *)Arena::AllocateAlignedNoHook(pAVar4,8);
        }
        *(undefined4 *)this_01 = 0;
        uVar8 = Reflection::GetEnumValue(this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
LAB_002e4bcc:
        *(uint32 *)this_01 = uVar8;
        break;
      case 9:
        pAVar4 = (this->
                 super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                 ).super_MapFieldBase.arena_;
        if (pAVar4 == (Arena *)0x0) {
          this_01 = (string *)operator_new(0x20);
        }
        else {
          if (pAVar4->hooks_cookie_ != (void *)0x0) {
            Arena::OnArenaAllocation(pAVar4,(type_info *)&std::__cxx11::string::typeinfo,0x20);
          }
          this_01 = (string *)
                    ArenaImpl::AllocateAlignedAndAddCleanup
                              (&pAVar4->impl_,0x20,arena_destruct_object<std::__cxx11::string>);
        }
        *(string **)this_01 = this_01 + 0x10;
        *(undefined8 *)(this_01 + 8) = 0;
        this_01[0x10] = (string)0x0;
        Reflection::GetString_abi_cxx11_
                  ((string *)local_c0,this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00);
        std::__cxx11::string::operator=(this_01,(string *)local_c0);
        if ((Node *)local_c0._0_8_ != &local_b0) {
          operator_delete((void *)local_c0._0_8_);
        }
        break;
      case 10:
        pMVar10 = Reflection::GetMessage
                            (this_02,(Message *)*ppvVar13,(FieldDescriptor *)field_00,
                             (MessageFactory *)0x0);
        iVar7 = (*(pMVar10->super_MessageLite)._vptr_MessageLite[4])
                          (pMVar10,(local_88->
                                   super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
                                   ).super_MapFieldBase.arena_);
        this_01 = (string *)CONCAT44(extraout_var_01,iVar7);
        (**(code **)((long)*(double *)this_01 + 0x70))(this_01,pMVar10);
        break;
      default:
        goto switchD_002e4915_default;
      }
      pMVar9->data_ = this_01;
      this = local_88;
switchD_002e4915_default:
      if ((local_58 == 9) && (auStack_78 != (undefined1  [8])&iter.it_.m_)) {
        operator_delete((void *)auStack_78);
      }
      ppvVar13 = ppvVar13 + 1;
      pRVar1 = (this->
               super_TypeDefinedMapFieldBase<google::protobuf::MapKey,_google::protobuf::MapValueRef>
               ).super_MapFieldBase.repeated_field_;
      pRVar2 = (pRVar1->super_RepeatedPtrFieldBase).rep_;
      ppvVar12 = pRVar2->elements;
      if (pRVar2 == (Rep *)0x0) {
        ppvVar12 = (void **)0x0;
      }
    } while (ppvVar13 != ppvVar12 + (pRVar1->super_RepeatedPtrFieldBase).current_size_);
  }
  return;
}

Assistant:

void DynamicMapField::SyncMapWithRepeatedFieldNoLock() const {
  Map<MapKey, MapValueRef>* map = &const_cast<DynamicMapField*>(this)->map_;
  const Reflection* reflection = default_entry_->GetReflection();
  const FieldDescriptor* key_des = default_entry_->GetDescriptor()->map_key();
  const FieldDescriptor* val_des = default_entry_->GetDescriptor()->map_value();
  // DynamicMapField owns map values. Need to delete them before clearing
  // the map.
  if (MapFieldBase::arena_ == nullptr) {
    for (Map<MapKey, MapValueRef>::iterator iter = map->begin();
         iter != map->end(); ++iter) {
      iter->second.DeleteData();
    }
  }
  map->clear();
  for (RepeatedPtrField<Message>::iterator it =
           MapFieldBase::repeated_field_->begin();
       it != MapFieldBase::repeated_field_->end(); ++it) {
    // MapKey type will be set later.
    MapKey map_key;
    switch (key_des->cpp_type()) {
      case FieldDescriptor::CPPTYPE_STRING:
        map_key.SetStringValue(reflection->GetString(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT64:
        map_key.SetInt64Value(reflection->GetInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_INT32:
        map_key.SetInt32Value(reflection->GetInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT64:
        map_key.SetUInt64Value(reflection->GetUInt64(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_UINT32:
        map_key.SetUInt32Value(reflection->GetUInt32(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_BOOL:
        map_key.SetBoolValue(reflection->GetBool(*it, key_des));
        break;
      case FieldDescriptor::CPPTYPE_DOUBLE:
      case FieldDescriptor::CPPTYPE_FLOAT:
      case FieldDescriptor::CPPTYPE_ENUM:
      case FieldDescriptor::CPPTYPE_MESSAGE:
        GOOGLE_LOG(FATAL) << "Can't get here.";
        break;
    }

    if (MapFieldBase::arena_ == nullptr) {
      // Remove existing map value with same key.
      Map<MapKey, MapValueRef>::iterator iter = map->find(map_key);
      if (iter != map->end()) {
        iter->second.DeleteData();
      }
    }

    MapValueRef& map_val = (*map)[map_key];
    map_val.SetType(val_des->cpp_type());
    switch (val_des->cpp_type()) {
#define HANDLE_TYPE(CPPTYPE, TYPE, METHOD)                   \
  case FieldDescriptor::CPPTYPE_##CPPTYPE: {                 \
    TYPE* value = Arena::Create<TYPE>(MapFieldBase::arena_); \
    *value = reflection->Get##METHOD(*it, val_des);          \
    map_val.SetValue(value);                                 \
    break;                                                   \
  }
      HANDLE_TYPE(INT32, int32, Int32);
      HANDLE_TYPE(INT64, int64, Int64);
      HANDLE_TYPE(UINT32, uint32, UInt32);
      HANDLE_TYPE(UINT64, uint64, UInt64);
      HANDLE_TYPE(DOUBLE, double, Double);
      HANDLE_TYPE(FLOAT, float, Float);
      HANDLE_TYPE(BOOL, bool, Bool);
      HANDLE_TYPE(STRING, std::string, String);
      HANDLE_TYPE(ENUM, int32, EnumValue);
#undef HANDLE_TYPE
      case FieldDescriptor::CPPTYPE_MESSAGE: {
        const Message& message = reflection->GetMessage(*it, val_des);
        Message* value = message.New(MapFieldBase::arena_);
        value->CopyFrom(message);
        map_val.SetValue(value);
        break;
      }
    }
  }
}